

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  char *__s1;
  char *unaff_R14;
  bool bVar10;
  QPDF qpdf;
  vector<int,_std::allocator<int>_> numbers;
  QPDFOutlineDocumentHelper odh;
  QPDF aQStack_98 [12];
  uint local_8c;
  vector<int,_std::allocator<int>_> local_88;
  ulong local_70;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> local_68 [24];
  QPDFOutlineDocumentHelper local_50;
  
  pcVar4 = (char *)QUtil::getWhoami(*argv);
  whoami = pcVar4;
  if (argc == 2) {
    iVar2 = strcmp(argv[1],"--version");
    unaff_R14 = pcVar4;
    if (iVar2 == 0) goto LAB_00103fb3;
  }
  pcVar4 = unaff_R14;
  bVar10 = 1 < argc;
  local_8c = argc;
  if (1 < argc) {
    __s1 = argv[1];
    uVar8 = 1;
    if (*__s1 == '-') {
      local_70 = (ulong)(uint)argc;
      lVar9 = 2 - local_70;
      pcVar4 = "--numbers";
      do {
        iVar2 = strcmp(__s1,"--numbers");
        if (iVar2 == 0) {
          style = st_numbers;
        }
        else {
          iVar2 = strcmp(__s1,"--lines");
          if (iVar2 == 0) {
            style = st_lines;
          }
          else {
            iVar2 = strcmp(__s1,"--show-open");
            if (iVar2 == 0) {
              show_open = 1;
            }
            else {
              iVar2 = strcmp(__s1,"--show-targets");
              if (iVar2 != 0) goto LAB_00103fae;
              show_targets = '\x01';
            }
          }
        }
        if (lVar9 + uVar8 == 1) goto LAB_00103fae;
        __s1 = argv[uVar8 + 1];
        uVar8 = uVar8 + 1;
      } while (*__s1 == '-');
      bVar10 = uVar8 < local_70;
    }
    if (bVar10) {
      uVar3 = (int)uVar8 + 1;
      if ((int)uVar3 < (int)local_8c) {
        uVar5 = (ulong)uVar3;
        uVar3 = (int)uVar8 + 2;
        pcVar4 = argv[uVar5];
      }
      else {
        pcVar4 = "";
      }
      if (uVar3 == local_8c) {
        pcVar4 = argv[uVar8 & 0xffffffff];
        QPDF::QPDF(aQStack_98);
        QPDF::processFile((char *)aQStack_98,pcVar4);
        QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(&local_50,aQStack_98);
        cVar1 = QPDFOutlineDocumentHelper::hasOutlines();
        if (cVar1 == '\0') {
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1080a0);
          }
          else {
            sVar6 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," has no bookmarks",0x11);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
          std::ostream::put(-0x60);
          std::ostream::flush();
        }
        else {
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          if (show_targets == '\x01') {
            generate_page_map(aQStack_98);
          }
          QPDFOutlineDocumentHelper::getTopLevelOutlines();
          extract_bookmarks(local_68,&local_88);
          std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
                    (local_68);
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper(&local_50);
        QPDF::~QPDF(aQStack_98);
        return 0;
      }
    }
  }
LAB_00103fae:
  usage();
LAB_00103fb3:
  poVar7 = std::operator<<((ostream *)&std::cout,pcVar4);
  poVar7 = std::operator<<(poVar7," version 1.5");
  std::endl<char,std::char_traits<char>>(poVar7);
  exit(0);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " version 1.5" << std::endl;
        exit(0);
    }

    int arg;
    for (arg = 1; arg < argc; ++arg) {
        if (argv[arg][0] == '-') {
            if (strcmp(argv[arg], "--numbers") == 0) {
                style = st_numbers;
            } else if (strcmp(argv[arg], "--lines") == 0) {
                style = st_lines;
            } else if (strcmp(argv[arg], "--show-open") == 0) {
                show_open = true;
            } else if (strcmp(argv[arg], "--show-targets") == 0) {
                show_targets = true;
            } else {
                usage();
            }
        } else {
            break;
        }
    }

    if (arg >= argc) {
        usage();
    }

    char const* filename = argv[arg++];
    char const* password = "";

    if (arg < argc) {
        password = argv[arg++];
    }
    if (arg != argc) {
        usage();
    }

    try {
        QPDF qpdf;
        qpdf.processFile(filename, password);

        QPDFOutlineDocumentHelper odh(qpdf);
        if (odh.hasOutlines()) {
            std::vector<int> numbers;
            if (show_targets) {
                generate_page_map(qpdf);
            }
            extract_bookmarks(odh.getTopLevelOutlines(), numbers);
        } else {
            std::cout << filename << " has no bookmarks" << std::endl;
        }
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << filename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}